

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int parse_filter(archive_read *a,uint8_t *bytes,uint16_t length,uint8_t flags)

{
  void *pvVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int64_t iVar4;
  uint8_t *bytes_00;
  rar_filter *prVar5;
  uint32_t local_e8;
  uint32_t local_e4;
  long *local_d8;
  rar_program_code **next;
  uint8_t *bytecode;
  uint32_t len;
  uint8_t mask;
  uint32_t i;
  uint32_t registers [8];
  size_t blockstartpos;
  uint8_t *globaldata;
  uint32_t globaldatalen;
  uint32_t blocklength;
  uint32_t num;
  uint32_t numprogs;
  rar_filter **nextfilter;
  rar_filter *filter;
  rar_program_code *prog;
  memory_bit_reader br;
  rar_filters *filters;
  rar *rar;
  uint8_t flags_local;
  uint16_t length_local;
  uint8_t *bytes_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  br._32_8_ = (long)pvVar1 + 0x390;
  memset(&prog,0,0x28);
  memset(&stack0xffffffffffffff48,0,0x20);
  br.bytes = (uint8_t *)(ulong)length;
  blocklength = 0;
  for (filter = *(rar_filter **)(br._32_8_ + 8); filter != (rar_filter *)0x0;
      filter = *(rar_filter **)&filter->globaldatalen) {
    blocklength = blocklength + 1;
  }
  prog = (rar_program_code *)bytes;
  if ((flags & 0x80) == 0) {
    globaldatalen = *(uint32_t *)(br._32_8_ + 0x20);
  }
  else {
    uVar2 = membr_next_rarvm_number((memory_bit_reader *)&prog);
    if (uVar2 == 0) {
      delete_filter(*(rar_filter **)(br._32_8_ + 0x10));
      *(undefined8 *)(br._32_8_ + 0x10) = 0;
      delete_program_code(*(rar_program_code **)(br._32_8_ + 8));
      *(undefined8 *)(br._32_8_ + 8) = 0;
      globaldatalen = 0;
    }
    else {
      globaldatalen = uVar2 - 1;
    }
    if (blocklength < globaldatalen) {
      return 0;
    }
    *(uint32_t *)(br._32_8_ + 0x20) = globaldatalen;
  }
  filter = *(rar_filter **)(br._32_8_ + 8);
  for (len = 0; len < globaldatalen; len = len + 1) {
    filter = *(rar_filter **)&filter->globaldatalen;
  }
  if (filter != (rar_filter *)0x0) {
    *(int *)&filter->globaldata = *(int *)&filter->globaldata + 1;
  }
  uVar2 = membr_next_rarvm_number((memory_bit_reader *)&prog);
  iVar4 = lzss_position((lzss *)((long)pvVar1 + 0x350));
  registers._24_8_ = (ulong)uVar2 + iVar4;
  if ((flags & 0x40) != 0) {
    registers._24_8_ = registers._24_8_ + 0x102;
  }
  if ((flags & 0x20) == 0) {
    if (filter == (rar_filter *)0x0) {
      local_e4 = 0;
    }
    else {
      local_e4 = *(uint32_t *)((long)&filter->globaldata + 4);
    }
    globaldata._4_4_ = local_e4;
  }
  else {
    globaldata._4_4_ = membr_next_rarvm_number((memory_bit_reader *)&prog);
  }
  registers[1] = 0x3c000;
  registers[2] = globaldata._4_4_;
  if (filter == (rar_filter *)0x0) {
    local_e8 = 0;
  }
  else {
    local_e8 = *(uint32_t *)&filter->globaldata;
  }
  registers[3] = local_e8;
  registers[5] = 0x40000;
  if ((flags & 0x10) != 0) {
    uVar2 = membr_bits((memory_bit_reader *)&prog,7);
    for (len = 0; len < 7; len = len + 1) {
      if ((uVar2 & 0xff & 1 << ((byte)len & 0x1f)) != 0) {
        uVar3 = membr_next_rarvm_number((memory_bit_reader *)&prog);
        registers[(ulong)len - 2] = uVar3;
      }
    }
  }
  if (filter == (rar_filter *)0x0) {
    uVar2 = membr_next_rarvm_number((memory_bit_reader *)&prog);
    if ((uVar2 == 0) || (0x10000 < uVar2)) {
      return 0;
    }
    bytes_00 = (uint8_t *)malloc((ulong)uVar2);
    if (bytes_00 == (uint8_t *)0x0) {
      return 0;
    }
    for (len = 0; len < uVar2; len = len + 1) {
      uVar3 = membr_bits((memory_bit_reader *)&prog,8);
      bytes_00[len] = (uint8_t)uVar3;
    }
    filter = (rar_filter *)compile_program(bytes_00,(ulong)uVar2);
    if (filter == (rar_filter *)0x0) {
      free(bytes_00);
      return 0;
    }
    free(bytes_00);
    for (local_d8 = (long *)(br._32_8_ + 8); *local_d8 != 0; local_d8 = (long *)(*local_d8 + 0x30))
    {
    }
    *local_d8 = (long)filter;
  }
  *(uint32_t *)((long)&filter->globaldata + 4) = globaldata._4_4_;
  blockstartpos = 0;
  globaldata._0_4_ = 0;
  if ((flags & 8) != 0) {
    globaldata._0_4_ = membr_next_rarvm_number((memory_bit_reader *)&prog);
    if (0x1fc0 < (uint32_t)globaldata) {
      return 0;
    }
    blockstartpos = (size_t)malloc((ulong)((uint32_t)globaldata + 0x40));
    if ((void *)blockstartpos == (void *)0x0) {
      return 0;
    }
    for (len = 0; len < (uint32_t)globaldata; len = len + 1) {
      uVar2 = membr_bits((memory_bit_reader *)&prog,8);
      *(char *)(blockstartpos + (len + 0x40)) = (char)uVar2;
    }
  }
  if (br.bits._4_4_ == 0) {
    prVar5 = create_filter((rar_program_code *)filter,(uint8_t *)blockstartpos,(uint32_t)globaldata,
                           (uint32_t *)&stack0xffffffffffffff48,registers._24_8_,globaldata._4_4_);
    free((void *)blockstartpos);
    if (prVar5 == (rar_filter *)0x0) {
      a_local._4_4_ = 0;
    }
    else {
      for (len = 0; len < 7; len = len + 1) {
        archive_le32enc(prVar5->globaldata + (len << 2),registers[(ulong)len - 2]);
      }
      archive_le32enc(prVar5->globaldata + 0x1c,globaldata._4_4_);
      archive_le32enc(prVar5->globaldata + 0x20,0);
      archive_le32enc(prVar5->globaldata + 0x2c,*(uint32_t *)&filter->globaldata);
      for (_num = (long *)(br._32_8_ + 0x10); *_num != 0; _num = (long *)(*_num + 0x50)) {
      }
      *_num = (long)prVar5;
      if (*(long *)(*(long *)(br._32_8_ + 0x10) + 0x50) == 0) {
        *(undefined8 *)(br._32_8_ + 0x18) = registers._24_8_;
      }
      a_local._4_4_ = 1;
    }
  }
  else {
    free((void *)blockstartpos);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
parse_filter(struct archive_read *a, const uint8_t *bytes, uint16_t length, uint8_t flags)
{
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_filters *filters = &rar->filters;

  struct memory_bit_reader br = { 0 };
  struct rar_program_code *prog;
  struct rar_filter *filter, **nextfilter;

  uint32_t numprogs, num, blocklength, globaldatalen;
  uint8_t *globaldata;
  size_t blockstartpos;
  uint32_t registers[8] = { 0 };
  uint32_t i;

  br.bytes = bytes;
  br.length = length;

  numprogs = 0;
  for (prog = filters->progs; prog; prog = prog->next)
    numprogs++;

  if ((flags & 0x80))
  {
    num = membr_next_rarvm_number(&br);
    if (num == 0)
    {
      delete_filter(filters->stack);
      filters->stack = NULL;
      delete_program_code(filters->progs);
      filters->progs = NULL;
    }
    else
      num--;
    if (num > numprogs) {
      return 0;
    }
    filters->lastfilternum = num;
  }
  else
    num = filters->lastfilternum;

  prog = filters->progs;
  for (i = 0; i < num; i++)
    prog = prog->next;
  if (prog)
    prog->usagecount++;

  blockstartpos = membr_next_rarvm_number(&br) + (size_t)lzss_position(&rar->lzss);
  if ((flags & 0x40))
    blockstartpos += 258;
  if ((flags & 0x20))
    blocklength = membr_next_rarvm_number(&br);
  else
    blocklength = prog ? prog->oldfilterlength : 0;

  registers[3] = PROGRAM_SYSTEM_GLOBAL_ADDRESS;
  registers[4] = blocklength;
  registers[5] = prog ? prog->usagecount : 0;
  registers[7] = VM_MEMORY_SIZE;

  if ((flags & 0x10))
  {
    uint8_t mask = (uint8_t)membr_bits(&br, 7);
    for (i = 0; i < 7; i++)
      if ((mask & (1 << i)))
        registers[i] = membr_next_rarvm_number(&br);
  }

  if (!prog)
  {
    uint32_t len = membr_next_rarvm_number(&br);
    uint8_t *bytecode;
    struct rar_program_code **next;

    if (len == 0 || len > 0x10000)
      return 0;
    bytecode = malloc(len);
    if (!bytecode)
      return 0;
    for (i = 0; i < len; i++)
      bytecode[i] = (uint8_t)membr_bits(&br, 8);
    prog = compile_program(bytecode, len);
    if (!prog) {
      free(bytecode);
      return 0;
    }
    free(bytecode);
    next = &filters->progs;
    while (*next)
      next = &(*next)->next;
    *next = prog;
  }
  prog->oldfilterlength = blocklength;

  globaldata = NULL;
  globaldatalen = 0;
  if ((flags & 0x08))
  {
    globaldatalen = membr_next_rarvm_number(&br);
    if (globaldatalen > PROGRAM_USER_GLOBAL_SIZE)
      return 0;
    globaldata = malloc(globaldatalen + PROGRAM_SYSTEM_GLOBAL_SIZE);
    if (!globaldata)
      return 0;
    for (i = 0; i < globaldatalen; i++)
      globaldata[i + PROGRAM_SYSTEM_GLOBAL_SIZE] = (uint8_t)membr_bits(&br, 8);
  }

  if (br.at_eof)
  {
      free(globaldata);
      return 0;
  }

  filter = create_filter(prog, globaldata, globaldatalen, registers, blockstartpos, blocklength);
  free(globaldata);
  if (!filter)
    return 0;

  for (i = 0; i < 7; i++)
    archive_le32enc(&filter->globaldata[i * 4], registers[i]);
  archive_le32enc(&filter->globaldata[0x1C], blocklength);
  archive_le32enc(&filter->globaldata[0x20], 0);
  archive_le32enc(&filter->globaldata[0x2C], prog->usagecount);

  nextfilter = &filters->stack;
  while (*nextfilter)
    nextfilter = &(*nextfilter)->next;
  *nextfilter = filter;

  if (!filters->stack->next)
    filters->filterstart = blockstartpos;

  return 1;
}